

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_container_unit.c
# Opt level: O1

size_t populate(uint16_t *buffer,size_t maxsize)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  splitmix64_x = splitmix64_x + 0x9e3779b97f4a7c15;
  uVar1 = (splitmix64_x >> 0x1e ^ splitmix64_x) * -0x40a7b892e31b1a47;
  uVar1 = (uVar1 >> 0x1b ^ uVar1) * -0x6b2fb644ecceee15;
  uVar1 = (uVar1 >> 0x1f ^ uVar1) % maxsize;
  if (uVar1 != 0) {
    uVar2 = 0;
    do {
      splitmix64_x = splitmix64_x + 0x9e3779b97f4a7c15;
      uVar3 = (splitmix64_x >> 0x1e ^ splitmix64_x) * -0x40a7b892e31b1a47;
      uVar3 = (uVar3 >> 0x1b ^ uVar3) * -0x6b2fb644ecceee15;
      buffer[uVar2] = (ushort)(uVar3 >> 0x1f) ^ (ushort)uVar3;
      uVar2 = uVar2 + 1;
    } while (uVar2 < uVar1);
  }
  return uVar1;
}

Assistant:

size_t populate(uint16_t* buffer, size_t maxsize) {
    size_t length = splitmix64() % maxsize;
    for (size_t i = 0; i < length; i++) {
        buffer[i] = (uint16_t)splitmix64();
    }
    return length;
}